

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void idct64_stage7_high48_sse2(__m128i *x,int32_t *cospi,__m128i __rounding,int8_t cos_bit)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  uint uVar51;
  int iVar52;
  char in_DL;
  long in_RSI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  __m128i _in1_11;
  __m128i _in0_11;
  __m128i _in1_10;
  __m128i _in0_10;
  __m128i _in1_9;
  __m128i _in0_9;
  __m128i _in1_8;
  __m128i _in0_8;
  __m128i _in1_7;
  __m128i _in0_7;
  __m128i _in1_6;
  __m128i _in0_6;
  __m128i _in1_5;
  __m128i _in0_5;
  __m128i _in1_4;
  __m128i _in0_4;
  __m128i _in1_3;
  __m128i _in0_3;
  __m128i _in1_2;
  __m128i _in0_2;
  __m128i _in1_1;
  __m128i _in0_1;
  __m128i _in1;
  __m128i _in0;
  __m128i d1_3;
  __m128i d0_3;
  __m128i c1_3;
  __m128i c0_3;
  __m128i b1_3;
  __m128i b0_3;
  __m128i a1_3;
  __m128i a0_3;
  __m128i v1_3;
  __m128i v0_3;
  __m128i u1_3;
  __m128i u0_3;
  __m128i t1_3;
  __m128i t0_3;
  __m128i d1_2;
  __m128i d0_2;
  __m128i c1_2;
  __m128i c0_2;
  __m128i b1_2;
  __m128i b0_2;
  __m128i a1_2;
  __m128i a0_2;
  __m128i v1_2;
  __m128i v0_2;
  __m128i u1_2;
  __m128i u0_2;
  __m128i t1_2;
  __m128i t0_2;
  __m128i d1_1;
  __m128i d0_1;
  __m128i c1_1;
  __m128i c0_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  __m128i v1_1;
  __m128i v0_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i cospi_m48_m16;
  __m128i cospi_p48_p16;
  __m128i cospi_m16_p48;
  undefined2 local_c68;
  undefined2 uStack_c66;
  undefined2 uStack_c64;
  undefined2 uStack_c62;
  undefined2 local_c58;
  undefined2 uStack_c56;
  undefined2 uStack_c54;
  undefined2 uStack_c52;
  undefined2 local_c48;
  undefined2 uStack_c46;
  undefined2 uStack_c44;
  undefined2 uStack_c42;
  undefined2 local_c38;
  undefined2 uStack_c36;
  undefined2 uStack_c34;
  undefined2 uStack_c32;
  undefined2 local_c28;
  undefined2 uStack_c26;
  undefined2 uStack_c24;
  undefined2 uStack_c22;
  undefined2 local_c18;
  undefined2 uStack_c16;
  undefined2 uStack_c14;
  undefined2 uStack_c12;
  undefined2 local_c08;
  undefined2 uStack_c06;
  undefined2 uStack_c04;
  undefined2 uStack_c02;
  undefined2 local_bf8;
  undefined2 uStack_bf6;
  undefined2 uStack_bf4;
  undefined2 uStack_bf2;
  undefined2 uStack_be0;
  undefined2 uStack_bde;
  undefined2 uStack_bdc;
  undefined2 uStack_bda;
  undefined2 uStack_bd0;
  undefined2 uStack_bce;
  undefined2 uStack_bcc;
  undefined2 uStack_bca;
  undefined2 uStack_bc0;
  undefined2 uStack_bbe;
  undefined2 uStack_bbc;
  undefined2 uStack_bba;
  undefined2 uStack_bb0;
  undefined2 uStack_bae;
  undefined2 uStack_bac;
  undefined2 uStack_baa;
  undefined2 uStack_ba0;
  undefined2 uStack_b9e;
  undefined2 uStack_b9c;
  undefined2 uStack_b9a;
  undefined2 uStack_b90;
  undefined2 uStack_b8e;
  undefined2 uStack_b8c;
  undefined2 uStack_b8a;
  undefined2 uStack_b80;
  undefined2 uStack_b7e;
  undefined2 uStack_b7c;
  undefined2 uStack_b7a;
  undefined2 uStack_b70;
  undefined2 uStack_b6e;
  undefined2 uStack_b6c;
  undefined2 uStack_b6a;
  undefined4 local_958;
  undefined4 uStack_954;
  undefined4 uStack_950;
  undefined4 uStack_94c;
  undefined4 local_938;
  undefined4 uStack_934;
  undefined4 uStack_930;
  undefined4 uStack_92c;
  undefined4 local_918;
  undefined4 uStack_914;
  undefined4 uStack_910;
  undefined4 uStack_90c;
  undefined4 local_8f8;
  undefined4 uStack_8f4;
  undefined4 uStack_8f0;
  undefined4 uStack_8ec;
  undefined4 local_8d8;
  undefined4 uStack_8d4;
  undefined4 uStack_8d0;
  undefined4 uStack_8cc;
  undefined4 local_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 local_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 local_878;
  undefined4 uStack_874;
  undefined4 uStack_870;
  undefined4 uStack_86c;
  undefined4 local_858;
  undefined4 uStack_854;
  undefined4 uStack_850;
  undefined4 uStack_84c;
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined4 local_818;
  undefined4 uStack_814;
  undefined4 uStack_810;
  undefined4 uStack_80c;
  undefined4 local_7f8;
  undefined4 uStack_7f4;
  undefined4 uStack_7f0;
  undefined4 uStack_7ec;
  undefined4 local_7d8;
  undefined4 uStack_7d4;
  undefined4 uStack_7d0;
  undefined4 uStack_7cc;
  undefined4 local_7b8;
  undefined4 uStack_7b4;
  undefined4 uStack_7b0;
  undefined4 uStack_7ac;
  undefined4 local_798;
  undefined4 uStack_794;
  undefined4 uStack_790;
  undefined4 uStack_78c;
  undefined4 local_788;
  undefined4 uStack_784;
  undefined4 uStack_780;
  undefined4 uStack_77c;
  undefined4 local_778;
  undefined4 uStack_774;
  undefined4 uStack_770;
  undefined4 uStack_76c;
  __m128i _in1_15;
  __m128i _in0_15;
  __m128i _in1_14;
  __m128i _in0_14;
  __m128i _in1_13;
  __m128i _in0_13;
  __m128i _in1_12;
  __m128i _in0_12;
  
  uVar51 = -*(int *)(in_RSI + 0x40) & 0xffffU | *(int *)(in_RSI + 0xc0) << 0x10;
  uVar45 = CONCAT44(uVar51,uVar51);
  uVar46 = CONCAT44(uVar51,uVar51);
  uVar51 = (uint)*(ushort *)(in_RSI + 0xc0) | *(int *)(in_RSI + 0x40) << 0x10;
  uVar47 = CONCAT44(uVar51,uVar51);
  uVar48 = CONCAT44(uVar51,uVar51);
  iVar52 = (-*(int *)(in_RSI + 0xc0) & 0xffffU) + *(int *)(in_RSI + 0x40) * -0x10000;
  uVar49 = CONCAT44(iVar52,iVar52);
  uVar50 = CONCAT44(iVar52,iVar52);
  uVar1 = *(undefined8 *)(in_RDI + 0x120);
  uVar2 = *(undefined8 *)(in_RDI + 0x1d0);
  local_bf8 = (undefined2)uVar1;
  uStack_bf6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_bf4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_bf2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_c08 = (undefined2)uVar2;
  uStack_c06 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_c04 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_c02 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x128);
  uVar2 = *(undefined8 *)(in_RDI + 0x1d8);
  uStack_b70 = (undefined2)uVar1;
  uStack_b6e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_b6c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_b6a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_b80 = (undefined2)uVar2;
  uStack_b7e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_b7c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_b7a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar28._2_2_ = local_c08;
  auVar28._0_2_ = local_bf8;
  auVar28._4_2_ = uStack_bf6;
  auVar28._6_2_ = uStack_c06;
  auVar28._10_2_ = uStack_c04;
  auVar28._8_2_ = uStack_bf4;
  auVar28._12_2_ = uStack_bf2;
  auVar28._14_2_ = uStack_c02;
  auVar27._8_8_ = uVar46;
  auVar27._0_8_ = uVar45;
  auVar53 = pmaddwd(auVar28,auVar27);
  auVar26._2_2_ = uStack_b80;
  auVar26._0_2_ = uStack_b70;
  auVar26._4_2_ = uStack_b6e;
  auVar26._6_2_ = uStack_b7e;
  auVar26._10_2_ = uStack_b7c;
  auVar26._8_2_ = uStack_b6c;
  auVar26._12_2_ = uStack_b6a;
  auVar26._14_2_ = uStack_b7a;
  auVar25._8_8_ = uVar46;
  auVar25._0_8_ = uVar45;
  auVar54 = pmaddwd(auVar26,auVar25);
  auVar24._2_2_ = local_c08;
  auVar24._0_2_ = local_bf8;
  auVar24._4_2_ = uStack_bf6;
  auVar24._6_2_ = uStack_c06;
  auVar24._10_2_ = uStack_c04;
  auVar24._8_2_ = uStack_bf4;
  auVar24._12_2_ = uStack_bf2;
  auVar24._14_2_ = uStack_c02;
  auVar23._8_8_ = uVar48;
  auVar23._0_8_ = uVar47;
  auVar55 = pmaddwd(auVar24,auVar23);
  auVar22._2_2_ = uStack_b80;
  auVar22._0_2_ = uStack_b70;
  auVar22._4_2_ = uStack_b6e;
  auVar22._6_2_ = uStack_b7e;
  auVar22._10_2_ = uStack_b7c;
  auVar22._8_2_ = uStack_b6c;
  auVar22._12_2_ = uStack_b6a;
  auVar22._14_2_ = uStack_b7a;
  auVar21._8_8_ = uVar48;
  auVar21._0_8_ = uVar47;
  auVar56 = pmaddwd(auVar22,auVar21);
  local_778 = auVar53._0_4_;
  uStack_774 = auVar53._4_4_;
  uStack_770 = auVar53._8_4_;
  uStack_76c = auVar53._12_4_;
  local_788 = (int)in_XMM0_Qa;
  uStack_784 = (int)((ulong)in_XMM0_Qa >> 0x20);
  uStack_780 = (int)in_XMM0_Qb;
  uStack_77c = (int)((ulong)in_XMM0_Qb >> 0x20);
  local_798 = auVar54._0_4_;
  uStack_794 = auVar54._4_4_;
  uStack_790 = auVar54._8_4_;
  uStack_78c = auVar54._12_4_;
  local_7b8 = auVar55._0_4_;
  uStack_7b4 = auVar55._4_4_;
  uStack_7b0 = auVar55._8_4_;
  uStack_7ac = auVar55._12_4_;
  local_7d8 = auVar56._0_4_;
  uStack_7d4 = auVar56._4_4_;
  uStack_7d0 = auVar56._8_4_;
  uStack_7cc = auVar56._12_4_;
  auVar53 = ZEXT416((uint)(int)in_DL);
  auVar54 = ZEXT416((uint)(int)in_DL);
  auVar55 = ZEXT416((uint)(int)in_DL);
  auVar56 = ZEXT416((uint)(int)in_DL);
  auVar44._4_4_ = uStack_774 + uStack_784 >> auVar53;
  auVar44._0_4_ = local_778 + local_788 >> auVar53;
  auVar44._12_4_ = uStack_76c + uStack_77c >> auVar53;
  auVar44._8_4_ = uStack_770 + uStack_780 >> auVar53;
  auVar43._4_4_ = uStack_794 + uStack_784 >> auVar54;
  auVar43._0_4_ = local_798 + local_788 >> auVar54;
  auVar43._12_4_ = uStack_78c + uStack_77c >> auVar54;
  auVar43._8_4_ = uStack_790 + uStack_780 >> auVar54;
  auVar53 = packssdw(auVar44,auVar43);
  *(undefined1 (*) [16])(in_RDI + 0x120) = auVar53;
  auVar42._4_4_ = uStack_7b4 + uStack_784 >> auVar55;
  auVar42._0_4_ = local_7b8 + local_788 >> auVar55;
  auVar42._12_4_ = uStack_7ac + uStack_77c >> auVar55;
  auVar42._8_4_ = uStack_7b0 + uStack_780 >> auVar55;
  auVar41._4_4_ = uStack_7d4 + uStack_784 >> auVar56;
  auVar41._0_4_ = local_7d8 + local_788 >> auVar56;
  auVar41._12_4_ = uStack_7cc + uStack_77c >> auVar56;
  auVar41._8_4_ = uStack_7d0 + uStack_780 >> auVar56;
  auVar53 = packssdw(auVar42,auVar41);
  *(undefined1 (*) [16])(in_RDI + 0x1d0) = auVar53;
  uVar1 = *(undefined8 *)(in_RDI + 0x130);
  uVar2 = *(undefined8 *)(in_RDI + 0x1c0);
  local_c18 = (undefined2)uVar1;
  uStack_c16 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_c14 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_c12 = (undefined2)((ulong)uVar1 >> 0x30);
  local_c28 = (undefined2)uVar2;
  uStack_c26 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_c24 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_c22 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x138);
  uVar2 = *(undefined8 *)(in_RDI + 0x1c8);
  uStack_b90 = (undefined2)uVar1;
  uStack_b8e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_b8c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_b8a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_ba0 = (undefined2)uVar2;
  uStack_b9e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_b9c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_b9a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar20._2_2_ = local_c28;
  auVar20._0_2_ = local_c18;
  auVar20._4_2_ = uStack_c16;
  auVar20._6_2_ = uStack_c26;
  auVar20._10_2_ = uStack_c24;
  auVar20._8_2_ = uStack_c14;
  auVar20._12_2_ = uStack_c12;
  auVar20._14_2_ = uStack_c22;
  auVar19._8_8_ = uVar46;
  auVar19._0_8_ = uVar45;
  auVar53 = pmaddwd(auVar20,auVar19);
  auVar18._2_2_ = uStack_ba0;
  auVar18._0_2_ = uStack_b90;
  auVar18._4_2_ = uStack_b8e;
  auVar18._6_2_ = uStack_b9e;
  auVar18._10_2_ = uStack_b9c;
  auVar18._8_2_ = uStack_b8c;
  auVar18._12_2_ = uStack_b8a;
  auVar18._14_2_ = uStack_b9a;
  auVar17._8_8_ = uVar46;
  auVar17._0_8_ = uVar45;
  auVar54 = pmaddwd(auVar18,auVar17);
  auVar16._2_2_ = local_c28;
  auVar16._0_2_ = local_c18;
  auVar16._4_2_ = uStack_c16;
  auVar16._6_2_ = uStack_c26;
  auVar16._10_2_ = uStack_c24;
  auVar16._8_2_ = uStack_c14;
  auVar16._12_2_ = uStack_c12;
  auVar16._14_2_ = uStack_c22;
  auVar15._8_8_ = uVar48;
  auVar15._0_8_ = uVar47;
  auVar55 = pmaddwd(auVar16,auVar15);
  auVar14._2_2_ = uStack_ba0;
  auVar14._0_2_ = uStack_b90;
  auVar14._4_2_ = uStack_b8e;
  auVar14._6_2_ = uStack_b9e;
  auVar14._10_2_ = uStack_b9c;
  auVar14._8_2_ = uStack_b8c;
  auVar14._12_2_ = uStack_b8a;
  auVar14._14_2_ = uStack_b9a;
  auVar13._8_8_ = uVar48;
  auVar13._0_8_ = uVar47;
  auVar56 = pmaddwd(auVar14,auVar13);
  local_7f8 = auVar53._0_4_;
  uStack_7f4 = auVar53._4_4_;
  uStack_7f0 = auVar53._8_4_;
  uStack_7ec = auVar53._12_4_;
  local_818 = auVar54._0_4_;
  uStack_814 = auVar54._4_4_;
  uStack_810 = auVar54._8_4_;
  uStack_80c = auVar54._12_4_;
  local_838 = auVar55._0_4_;
  uStack_834 = auVar55._4_4_;
  uStack_830 = auVar55._8_4_;
  uStack_82c = auVar55._12_4_;
  local_858 = auVar56._0_4_;
  uStack_854 = auVar56._4_4_;
  uStack_850 = auVar56._8_4_;
  uStack_84c = auVar56._12_4_;
  auVar53 = ZEXT416((uint)(int)in_DL);
  auVar54 = ZEXT416((uint)(int)in_DL);
  auVar55 = ZEXT416((uint)(int)in_DL);
  auVar56 = ZEXT416((uint)(int)in_DL);
  auVar40._4_4_ = uStack_7f4 + uStack_784 >> auVar53;
  auVar40._0_4_ = local_7f8 + local_788 >> auVar53;
  auVar40._12_4_ = uStack_7ec + uStack_77c >> auVar53;
  auVar40._8_4_ = uStack_7f0 + uStack_780 >> auVar53;
  auVar39._4_4_ = uStack_814 + uStack_784 >> auVar54;
  auVar39._0_4_ = local_818 + local_788 >> auVar54;
  auVar39._12_4_ = uStack_80c + uStack_77c >> auVar54;
  auVar39._8_4_ = uStack_810 + uStack_780 >> auVar54;
  auVar53 = packssdw(auVar40,auVar39);
  *(undefined1 (*) [16])(in_RDI + 0x130) = auVar53;
  auVar38._4_4_ = uStack_834 + uStack_784 >> auVar55;
  auVar38._0_4_ = local_838 + local_788 >> auVar55;
  auVar38._12_4_ = uStack_82c + uStack_77c >> auVar55;
  auVar38._8_4_ = uStack_830 + uStack_780 >> auVar55;
  auVar37._4_4_ = uStack_854 + uStack_784 >> auVar56;
  auVar37._0_4_ = local_858 + local_788 >> auVar56;
  auVar37._12_4_ = uStack_84c + uStack_77c >> auVar56;
  auVar37._8_4_ = uStack_850 + uStack_780 >> auVar56;
  auVar53 = packssdw(auVar38,auVar37);
  *(undefined1 (*) [16])(in_RDI + 0x1c0) = auVar53;
  uVar1 = *(undefined8 *)(in_RDI + 0x140);
  uVar2 = *(undefined8 *)(in_RDI + 0x1b0);
  local_c38 = (undefined2)uVar1;
  uStack_c36 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_c34 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_c32 = (undefined2)((ulong)uVar1 >> 0x30);
  local_c48 = (undefined2)uVar2;
  uStack_c46 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_c44 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_c42 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x148);
  uVar2 = *(undefined8 *)(in_RDI + 0x1b8);
  uStack_bb0 = (undefined2)uVar1;
  uStack_bae = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_bac = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_baa = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_bc0 = (undefined2)uVar2;
  uStack_bbe = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_bbc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_bba = (undefined2)((ulong)uVar2 >> 0x30);
  auVar12._2_2_ = local_c48;
  auVar12._0_2_ = local_c38;
  auVar12._4_2_ = uStack_c36;
  auVar12._6_2_ = uStack_c46;
  auVar12._10_2_ = uStack_c44;
  auVar12._8_2_ = uStack_c34;
  auVar12._12_2_ = uStack_c32;
  auVar12._14_2_ = uStack_c42;
  auVar11._8_8_ = uVar50;
  auVar11._0_8_ = uVar49;
  auVar53 = pmaddwd(auVar12,auVar11);
  auVar10._2_2_ = uStack_bc0;
  auVar10._0_2_ = uStack_bb0;
  auVar10._4_2_ = uStack_bae;
  auVar10._6_2_ = uStack_bbe;
  auVar10._10_2_ = uStack_bbc;
  auVar10._8_2_ = uStack_bac;
  auVar10._12_2_ = uStack_baa;
  auVar10._14_2_ = uStack_bba;
  auVar9._8_8_ = uVar50;
  auVar9._0_8_ = uVar49;
  auVar54 = pmaddwd(auVar10,auVar9);
  auVar8._2_2_ = local_c48;
  auVar8._0_2_ = local_c38;
  auVar8._4_2_ = uStack_c36;
  auVar8._6_2_ = uStack_c46;
  auVar8._10_2_ = uStack_c44;
  auVar8._8_2_ = uStack_c34;
  auVar8._12_2_ = uStack_c32;
  auVar8._14_2_ = uStack_c42;
  auVar7._8_8_ = uVar46;
  auVar7._0_8_ = uVar45;
  auVar55 = pmaddwd(auVar8,auVar7);
  auVar6._2_2_ = uStack_bc0;
  auVar6._0_2_ = uStack_bb0;
  auVar6._4_2_ = uStack_bae;
  auVar6._6_2_ = uStack_bbe;
  auVar6._10_2_ = uStack_bbc;
  auVar6._8_2_ = uStack_bac;
  auVar6._12_2_ = uStack_baa;
  auVar6._14_2_ = uStack_bba;
  auVar5._8_8_ = uVar46;
  auVar5._0_8_ = uVar45;
  auVar56 = pmaddwd(auVar6,auVar5);
  local_878 = auVar53._0_4_;
  uStack_874 = auVar53._4_4_;
  uStack_870 = auVar53._8_4_;
  uStack_86c = auVar53._12_4_;
  local_898 = auVar54._0_4_;
  uStack_894 = auVar54._4_4_;
  uStack_890 = auVar54._8_4_;
  uStack_88c = auVar54._12_4_;
  local_8b8 = auVar55._0_4_;
  uStack_8b4 = auVar55._4_4_;
  uStack_8b0 = auVar55._8_4_;
  uStack_8ac = auVar55._12_4_;
  local_8d8 = auVar56._0_4_;
  uStack_8d4 = auVar56._4_4_;
  uStack_8d0 = auVar56._8_4_;
  uStack_8cc = auVar56._12_4_;
  auVar53 = ZEXT416((uint)(int)in_DL);
  auVar54 = ZEXT416((uint)(int)in_DL);
  auVar55 = ZEXT416((uint)(int)in_DL);
  auVar56 = ZEXT416((uint)(int)in_DL);
  auVar36._4_4_ = uStack_874 + uStack_784 >> auVar53;
  auVar36._0_4_ = local_878 + local_788 >> auVar53;
  auVar36._12_4_ = uStack_86c + uStack_77c >> auVar53;
  auVar36._8_4_ = uStack_870 + uStack_780 >> auVar53;
  auVar35._4_4_ = uStack_894 + uStack_784 >> auVar54;
  auVar35._0_4_ = local_898 + local_788 >> auVar54;
  auVar35._12_4_ = uStack_88c + uStack_77c >> auVar54;
  auVar35._8_4_ = uStack_890 + uStack_780 >> auVar54;
  auVar53 = packssdw(auVar36,auVar35);
  *(undefined1 (*) [16])(in_RDI + 0x140) = auVar53;
  auVar34._4_4_ = uStack_8b4 + uStack_784 >> auVar55;
  auVar34._0_4_ = local_8b8 + local_788 >> auVar55;
  auVar34._12_4_ = uStack_8ac + uStack_77c >> auVar55;
  auVar34._8_4_ = uStack_8b0 + uStack_780 >> auVar55;
  auVar33._4_4_ = uStack_8d4 + uStack_784 >> auVar56;
  auVar33._0_4_ = local_8d8 + local_788 >> auVar56;
  auVar33._12_4_ = uStack_8cc + uStack_77c >> auVar56;
  auVar33._8_4_ = uStack_8d0 + uStack_780 >> auVar56;
  auVar53 = packssdw(auVar34,auVar33);
  *(undefined1 (*) [16])(in_RDI + 0x1b0) = auVar53;
  uVar1 = *(undefined8 *)(in_RDI + 0x150);
  uVar2 = *(undefined8 *)(in_RDI + 0x1a0);
  local_c58 = (undefined2)uVar1;
  uStack_c56 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_c54 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_c52 = (undefined2)((ulong)uVar1 >> 0x30);
  local_c68 = (undefined2)uVar2;
  uStack_c66 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_c64 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_c62 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x158);
  uVar2 = *(undefined8 *)(in_RDI + 0x1a8);
  uStack_bd0 = (undefined2)uVar1;
  uStack_bce = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_bcc = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_bca = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_be0 = (undefined2)uVar2;
  uStack_bde = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_bdc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_bda = (undefined2)((ulong)uVar2 >> 0x30);
  auVar4._2_2_ = local_c68;
  auVar4._0_2_ = local_c58;
  auVar4._4_2_ = uStack_c56;
  auVar4._6_2_ = uStack_c66;
  auVar4._10_2_ = uStack_c64;
  auVar4._8_2_ = uStack_c54;
  auVar4._12_2_ = uStack_c52;
  auVar4._14_2_ = uStack_c62;
  auVar57._8_8_ = uVar50;
  auVar57._0_8_ = uVar49;
  auVar57 = pmaddwd(auVar4,auVar57);
  auVar3._2_2_ = uStack_be0;
  auVar3._0_2_ = uStack_bd0;
  auVar3._4_2_ = uStack_bce;
  auVar3._6_2_ = uStack_bde;
  auVar3._10_2_ = uStack_bdc;
  auVar3._8_2_ = uStack_bcc;
  auVar3._12_2_ = uStack_bca;
  auVar3._14_2_ = uStack_bda;
  auVar58._8_8_ = uVar50;
  auVar58._0_8_ = uVar49;
  auVar58 = pmaddwd(auVar3,auVar58);
  auVar56._2_2_ = local_c68;
  auVar56._0_2_ = local_c58;
  auVar56._4_2_ = uStack_c56;
  auVar56._6_2_ = uStack_c66;
  auVar56._10_2_ = uStack_c64;
  auVar56._8_2_ = uStack_c54;
  auVar56._12_2_ = uStack_c52;
  auVar56._14_2_ = uStack_c62;
  auVar55._8_8_ = uVar46;
  auVar55._0_8_ = uVar45;
  auVar55 = pmaddwd(auVar56,auVar55);
  auVar54._2_2_ = uStack_be0;
  auVar54._0_2_ = uStack_bd0;
  auVar54._4_2_ = uStack_bce;
  auVar54._6_2_ = uStack_bde;
  auVar54._10_2_ = uStack_bdc;
  auVar54._8_2_ = uStack_bcc;
  auVar54._12_2_ = uStack_bca;
  auVar54._14_2_ = uStack_bda;
  auVar53._8_8_ = uVar46;
  auVar53._0_8_ = uVar45;
  auVar53 = pmaddwd(auVar54,auVar53);
  local_8f8 = auVar57._0_4_;
  uStack_8f4 = auVar57._4_4_;
  uStack_8f0 = auVar57._8_4_;
  uStack_8ec = auVar57._12_4_;
  local_918 = auVar58._0_4_;
  uStack_914 = auVar58._4_4_;
  uStack_910 = auVar58._8_4_;
  uStack_90c = auVar58._12_4_;
  local_938 = auVar55._0_4_;
  uStack_934 = auVar55._4_4_;
  uStack_930 = auVar55._8_4_;
  uStack_92c = auVar55._12_4_;
  local_958 = auVar53._0_4_;
  uStack_954 = auVar53._4_4_;
  uStack_950 = auVar53._8_4_;
  uStack_94c = auVar53._12_4_;
  auVar53 = ZEXT416((uint)(int)in_DL);
  auVar54 = ZEXT416((uint)(int)in_DL);
  auVar55 = ZEXT416((uint)(int)in_DL);
  auVar56 = ZEXT416((uint)(int)in_DL);
  auVar32._4_4_ = uStack_8f4 + uStack_784 >> auVar53;
  auVar32._0_4_ = local_8f8 + local_788 >> auVar53;
  auVar32._12_4_ = uStack_8ec + uStack_77c >> auVar53;
  auVar32._8_4_ = uStack_8f0 + uStack_780 >> auVar53;
  auVar31._4_4_ = uStack_914 + uStack_784 >> auVar54;
  auVar31._0_4_ = local_918 + local_788 >> auVar54;
  auVar31._12_4_ = uStack_90c + uStack_77c >> auVar54;
  auVar31._8_4_ = uStack_910 + uStack_780 >> auVar54;
  auVar53 = packssdw(auVar32,auVar31);
  *(undefined1 (*) [16])(in_RDI + 0x150) = auVar53;
  auVar30._4_4_ = uStack_934 + uStack_784 >> auVar55;
  auVar30._0_4_ = local_938 + local_788 >> auVar55;
  auVar30._12_4_ = uStack_92c + uStack_77c >> auVar55;
  auVar30._8_4_ = uStack_930 + uStack_780 >> auVar55;
  auVar29._4_4_ = uStack_954 + uStack_784 >> auVar56;
  auVar29._0_4_ = local_958 + local_788 >> auVar56;
  auVar29._12_4_ = uStack_94c + uStack_77c >> auVar56;
  auVar29._8_4_ = uStack_950 + uStack_780 >> auVar56;
  auVar53 = packssdw(auVar30,auVar29);
  *(undefined1 (*) [16])(in_RDI + 0x1a0) = auVar53;
  auVar53 = *(undefined1 (*) [16])(in_RDI + 0x200);
  auVar54 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x200),*(undefined1 (*) [16])(in_RDI + 0x270));
  *(undefined1 (*) [16])(in_RDI + 0x200) = auVar54;
  auVar53 = psubsw(auVar53,*(undefined1 (*) [16])(in_RDI + 0x270));
  *(undefined1 (*) [16])(in_RDI + 0x270) = auVar53;
  auVar53 = *(undefined1 (*) [16])(in_RDI + 0x210);
  auVar54 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x210),*(undefined1 (*) [16])(in_RDI + 0x260));
  *(undefined1 (*) [16])(in_RDI + 0x210) = auVar54;
  auVar53 = psubsw(auVar53,*(undefined1 (*) [16])(in_RDI + 0x260));
  *(undefined1 (*) [16])(in_RDI + 0x260) = auVar53;
  auVar53 = *(undefined1 (*) [16])(in_RDI + 0x220);
  auVar54 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x220),*(undefined1 (*) [16])(in_RDI + 0x250));
  *(undefined1 (*) [16])(in_RDI + 0x220) = auVar54;
  auVar53 = psubsw(auVar53,*(undefined1 (*) [16])(in_RDI + 0x250));
  *(undefined1 (*) [16])(in_RDI + 0x250) = auVar53;
  auVar53 = *(undefined1 (*) [16])(in_RDI + 0x230);
  auVar54 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x230),*(undefined1 (*) [16])(in_RDI + 0x240));
  *(undefined1 (*) [16])(in_RDI + 0x230) = auVar54;
  auVar53 = psubsw(auVar53,*(undefined1 (*) [16])(in_RDI + 0x240));
  *(undefined1 (*) [16])(in_RDI + 0x240) = auVar53;
  auVar53 = *(undefined1 (*) [16])(in_RDI + 0x280);
  auVar54 = psubsw(*(undefined1 (*) [16])(in_RDI + 0x2f0),*(undefined1 (*) [16])(in_RDI + 0x280));
  *(undefined1 (*) [16])(in_RDI + 0x280) = auVar54;
  auVar53 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x2f0),auVar53);
  *(undefined1 (*) [16])(in_RDI + 0x2f0) = auVar53;
  auVar53 = *(undefined1 (*) [16])(in_RDI + 0x290);
  auVar54 = psubsw(*(undefined1 (*) [16])(in_RDI + 0x2e0),*(undefined1 (*) [16])(in_RDI + 0x290));
  *(undefined1 (*) [16])(in_RDI + 0x290) = auVar54;
  auVar53 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x2e0),auVar53);
  *(undefined1 (*) [16])(in_RDI + 0x2e0) = auVar53;
  auVar53 = *(undefined1 (*) [16])(in_RDI + 0x2a0);
  auVar54 = psubsw(*(undefined1 (*) [16])(in_RDI + 0x2d0),*(undefined1 (*) [16])(in_RDI + 0x2a0));
  *(undefined1 (*) [16])(in_RDI + 0x2a0) = auVar54;
  auVar53 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x2d0),auVar53);
  *(undefined1 (*) [16])(in_RDI + 0x2d0) = auVar53;
  auVar53 = *(undefined1 (*) [16])(in_RDI + 0x2b0);
  auVar54 = psubsw(*(undefined1 (*) [16])(in_RDI + 0x2c0),*(undefined1 (*) [16])(in_RDI + 0x2b0));
  *(undefined1 (*) [16])(in_RDI + 0x2b0) = auVar54;
  auVar53 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x2c0),auVar53);
  *(undefined1 (*) [16])(in_RDI + 0x2c0) = auVar53;
  auVar53 = *(undefined1 (*) [16])(in_RDI + 0x300);
  auVar54 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x300),*(undefined1 (*) [16])(in_RDI + 0x370));
  *(undefined1 (*) [16])(in_RDI + 0x300) = auVar54;
  auVar53 = psubsw(auVar53,*(undefined1 (*) [16])(in_RDI + 0x370));
  *(undefined1 (*) [16])(in_RDI + 0x370) = auVar53;
  auVar53 = *(undefined1 (*) [16])(in_RDI + 0x310);
  auVar54 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x310),*(undefined1 (*) [16])(in_RDI + 0x360));
  *(undefined1 (*) [16])(in_RDI + 0x310) = auVar54;
  auVar53 = psubsw(auVar53,*(undefined1 (*) [16])(in_RDI + 0x360));
  *(undefined1 (*) [16])(in_RDI + 0x360) = auVar53;
  auVar53 = *(undefined1 (*) [16])(in_RDI + 800);
  auVar54 = paddsw(*(undefined1 (*) [16])(in_RDI + 800),*(undefined1 (*) [16])(in_RDI + 0x350));
  *(undefined1 (*) [16])(in_RDI + 800) = auVar54;
  auVar53 = psubsw(auVar53,*(undefined1 (*) [16])(in_RDI + 0x350));
  *(undefined1 (*) [16])(in_RDI + 0x350) = auVar53;
  auVar53 = *(undefined1 (*) [16])(in_RDI + 0x330);
  auVar54 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x330),*(undefined1 (*) [16])(in_RDI + 0x340));
  *(undefined1 (*) [16])(in_RDI + 0x330) = auVar54;
  auVar53 = psubsw(auVar53,*(undefined1 (*) [16])(in_RDI + 0x340));
  *(undefined1 (*) [16])(in_RDI + 0x340) = auVar53;
  auVar53 = *(undefined1 (*) [16])(in_RDI + 0x380);
  auVar54 = psubsw(*(undefined1 (*) [16])(in_RDI + 0x3f0),*(undefined1 (*) [16])(in_RDI + 0x380));
  *(undefined1 (*) [16])(in_RDI + 0x380) = auVar54;
  auVar53 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x3f0),auVar53);
  *(undefined1 (*) [16])(in_RDI + 0x3f0) = auVar53;
  auVar53 = *(undefined1 (*) [16])(in_RDI + 0x390);
  auVar54 = psubsw(*(undefined1 (*) [16])(in_RDI + 0x3e0),*(undefined1 (*) [16])(in_RDI + 0x390));
  *(undefined1 (*) [16])(in_RDI + 0x390) = auVar54;
  auVar53 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x3e0),auVar53);
  *(undefined1 (*) [16])(in_RDI + 0x3e0) = auVar53;
  auVar53 = *(undefined1 (*) [16])(in_RDI + 0x3a0);
  auVar54 = psubsw(*(undefined1 (*) [16])(in_RDI + 0x3d0),*(undefined1 (*) [16])(in_RDI + 0x3a0));
  *(undefined1 (*) [16])(in_RDI + 0x3a0) = auVar54;
  auVar53 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x3d0),auVar53);
  *(undefined1 (*) [16])(in_RDI + 0x3d0) = auVar53;
  auVar53 = *(undefined1 (*) [16])(in_RDI + 0x3b0);
  auVar54 = psubsw(*(undefined1 (*) [16])(in_RDI + 0x3c0),*(undefined1 (*) [16])(in_RDI + 0x3b0));
  *(undefined1 (*) [16])(in_RDI + 0x3b0) = auVar54;
  auVar53 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x3c0),auVar53);
  *(undefined1 (*) [16])(in_RDI + 0x3c0) = auVar53;
  return;
}

Assistant:

static inline void idct64_stage7_high48_sse2(__m128i *x, const int32_t *cospi,
                                             const __m128i __rounding,
                                             int8_t cos_bit) {
  const __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  const __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  const __m128i cospi_m48_m16 = pair_set_epi16(-cospi[48], -cospi[16]);
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[18], x[29], x[18], x[29]);
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[19], x[28], x[19], x[28]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[20], x[27], x[20], x[27]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[21], x[26], x[21], x[26]);
  btf_16_adds_subs_sse2(x[32], x[39]);
  btf_16_adds_subs_sse2(x[33], x[38]);
  btf_16_adds_subs_sse2(x[34], x[37]);
  btf_16_adds_subs_sse2(x[35], x[36]);
  btf_16_subs_adds_sse2(x[47], x[40]);
  btf_16_subs_adds_sse2(x[46], x[41]);
  btf_16_subs_adds_sse2(x[45], x[42]);
  btf_16_subs_adds_sse2(x[44], x[43]);
  btf_16_adds_subs_sse2(x[48], x[55]);
  btf_16_adds_subs_sse2(x[49], x[54]);
  btf_16_adds_subs_sse2(x[50], x[53]);
  btf_16_adds_subs_sse2(x[51], x[52]);
  btf_16_subs_adds_sse2(x[63], x[56]);
  btf_16_subs_adds_sse2(x[62], x[57]);
  btf_16_subs_adds_sse2(x[61], x[58]);
  btf_16_subs_adds_sse2(x[60], x[59]);
}